

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::SweepBucket
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          RecyclerSweep *recyclerSweep)

{
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlockList;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlockList_00;
  code *pcVar1;
  bool bVar2;
  RecyclerSweepManager *this_00;
  undefined4 *puVar3;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> **ppSVar4;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *currentHeapBlockList;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *currentFullBlockList;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *savedNextAllocableBlockHead;
  RecyclerSweep *recyclerSweep_local;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this_local;
  
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  VerifyHeapBlockCount(this,bVar2);
  this_00 = RecyclerSweep::GetManager(recyclerSweep);
  bVar2 = RecyclerSweepManager::HasSetupBackgroundSweep(this_00);
  if (bVar2) {
    bVar2 = IsAllocationStopped(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x4fd,"(IsAllocationStopped())","IsAllocationStopped()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    currentFullBlockList =
         RecyclerSweep::
         GetSavedNextAllocableBlockHead<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                   (recyclerSweep,this);
  }
  else {
    bVar2 = AllocatorsAreEmpty(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x503,"(AllocatorsAreEmpty())","AllocatorsAreEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    currentFullBlockList = this->nextAllocableBlockHead;
    StopAllocationBeforeSweep(this);
  }
  ppSVar4 = RecyclerSweep::
            GetPendingSweepBlockList<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                      (recyclerSweep,this);
  if (*ppSVar4 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x50a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                       "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RecyclerVerifyListConsistencyData::SetupVerifyListConsistencyDataForMediumBlock
            (&recyclerSweep->super_RecyclerVerifyListConsistencyData,
             &currentFullBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,true,
             false);
  heapBlockList = this->fullBlockList;
  heapBlockList_00 = this->heapBlockList;
  this->heapBlockList = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  this->fullBlockList = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  SweepHeapBlockList(this,recyclerSweep,heapBlockList_00,true);
  RecyclerVerifyListConsistencyData::SetupVerifyListConsistencyDataForMediumBlock
            (&recyclerSweep->super_RecyclerVerifyListConsistencyData,(MediumHeapBlock *)0x0,true,
             false);
  SweepHeapBlockList(this,recyclerSweep,heapBlockList,false);
  if (this->nextAllocableBlockHead != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x55e,"(this->nextAllocableBlockHead == nullptr)",
                       "this->nextAllocableBlockHead == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::SweepBucket(RecyclerSweep& recyclerSweep)
{
    DebugOnly(TBlockType * savedNextAllocableBlockHead);
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
#if ENABLE_CONCURRENT_GC
    if (recyclerSweep.GetManager()->HasSetupBackgroundSweep())
    {
        // SetupBackgroundSweep set nextAllocableBlockHead to null already
        Assert(IsAllocationStopped());
        DebugOnly(savedNextAllocableBlockHead = recyclerSweep.GetSavedNextAllocableBlockHead(this));
    }
    else
#endif
    {
        Assert(AllocatorsAreEmpty());
        DebugOnly(savedNextAllocableBlockHead = this->nextAllocableBlockHead);
        this->StopAllocationBeforeSweep();
    }

    // We just started sweeping.  These pending lists should be empty
#if ENABLE_CONCURRENT_GC
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);
#else
    Assert(!recyclerSweep.IsBackground());
#endif

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && this->sweepableHeapBlockList != nullptr)
    {
        Assert(!this->IsAnyFinalizableBucket());

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
#endif
        // Return the blocks we may have allocated from during the previous concurrent sweep back to the fullBlockList.
        // We need to rebuild the free bit vectors for these blocks.
        HeapBlockList::ForEachEditing(this->sweepableHeapBlockList, [this](TBlockType * heapBlock)
        {
            heapBlock->BuildFreeBitVector();

            AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
            AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
            AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");

            heapBlock->SetNextBlock(this->fullBlockList);
            this->fullBlockList = heapBlock;
        });
        this->sweepableHeapBlockList = nullptr;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        debugSweepableHeapBlockListLock.Leave();
#endif
    }
#endif

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock((SmallHeapBlock*) savedNextAllocableBlockHead, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock((MediumHeapBlock*) savedNextAllocableBlockHead, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    // Move the list locally.  We will relink them during sweep
    TBlockType * currentFullBlockList = fullBlockList;
    TBlockType * currentHeapBlockList = heapBlockList;
    this->heapBlockList = nullptr;
    this->fullBlockList = nullptr;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // In order to allow allocations during sweep (Pass-1) we will set aside blocks after nextAllocableBlockHead (excluding) and allow
    // allocations to these blocks as we know that these blocks are not full yet. These will need to be swept later though before starting Pass-2
    // of the sweep.
    this->PrepareForAllocationsDuringConcurrentSweep(currentHeapBlockList);
#endif

    this->SweepHeapBlockList(recyclerSweep, currentHeapBlockList, true);

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock(nullptr, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock(nullptr, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    this->SweepHeapBlockList(recyclerSweep, currentFullBlockList, false);

    // We shouldn't have allocate from any block yet
    Assert(this->nextAllocableBlockHead == nullptr);
}